

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::_InternalParse
          (RandomUniformStaticLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  float *local_50;
  uint local_44;
  InternalMetadata *local_40;
  RepeatedField<unsigned_long> *local_38;
  
  local_38 = &this->outputshape_;
  local_40 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = (float *)ptr;
LAB_00214914:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar1) {
      return (char *)local_50;
    }
    local_50 = (float *)google::protobuf::internal::ReadTag((char *)local_50,&local_44,0);
    tag_00 = local_44;
    cVar3 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar3 != '\b') break;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
      this->seed_ = uVar2;
      goto joined_r0x00214972;
    case 2:
      if (cVar3 == '\x15') {
        this->minval_ = *local_50;
LAB_002149b3:
        local_50 = local_50 + 1;
        goto LAB_00214914;
      }
      break;
    case 3:
      if (cVar3 == '\x1d') {
        this->maxval_ = *local_50;
        goto LAB_002149b3;
      }
      break;
    case 4:
      if (cVar3 == '\"') {
        local_50 = (float *)google::protobuf::internal::PackedUInt64Parser
                                      (local_38,(char *)local_50,ctx);
      }
      else {
        if ((local_44 & 0xff) != 0x20) break;
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
        _internal_add_outputshape(this,uVar2);
      }
      goto joined_r0x00214972;
    }
    if ((local_44 == 0) || ((local_44 & 7) == 4)) {
      if (local_50 == (float *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return (char *)local_50;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_40);
    local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                  (tag_00,unknown,(char *)local_50,ctx);
joined_r0x00214972:
    if (local_50 == (float *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* RandomUniformStaticLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int64 seed = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          seed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float minVal = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          minval_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float maxVal = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 29)) {
          maxval_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 outputShape = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_outputshape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 32) {
          _internal_add_outputshape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}